

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall
kratos::EnumConst::to_string_abi_cxx11_(string *__return_storage_ptr__,EnumConst *this)

{
  pointer pcVar1;
  iterator iVar2;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_70;
  EnumConst *local_50;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  size_type sStack_30;
  allocator_type local_21;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
          ::find(&(this->parent_->values)._M_t,&this->name_);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->parent_->values)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name_)._M_string_length);
    return __return_storage_ptr__;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(this->name_)._M_dataplus._M_p;
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)(this->name_)._M_string_length;
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->parent_->name)._M_dataplus._M_p;
  sStack_30 = (this->parent_->name)._M_string_length;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x1b;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_70,(detail *)"{0} is not in enum type {1}",format_str,args);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  local_50 = this;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_48,__l,&local_21);
  VarException::VarException(this_00,&local_70,&local_48);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string EnumConst::to_string() const {
    if (parent_->values.find(name_) == parent_->values.end()) {
        throw VarException(::format("{0} is not in enum type {1}", name_, parent_->name), {this});
    }
    return name_;
}